

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall wabt::interp::Thread::DoMemoryInit(Thread *this,Instr instr,Ptr *out_trap)

{
  pointer pDVar1;
  Store *store;
  uint uVar2;
  uint uVar3;
  Result RVar4;
  u64 dst_offset;
  RunResult RVar5;
  allocator local_81;
  Ptr memory;
  Ptr local_68;
  string local_50;
  
  RefPtr<wabt::interp::Memory>::RefPtr
            (&memory,this->store_,
             (Ref)(this->inst_->memories_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_start[instr.field_2.imm_u32].index);
  pDVar1 = (this->inst_->datas_).
           super__Vector_base<wabt::interp::DataSegment,_std::allocator<wabt::interp::DataSegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = Pop<unsigned_int>(this);
  uVar3 = Pop<unsigned_int>(this);
  dst_offset = PopPtr(this,&memory);
  RVar4 = Memory::Init(memory.obj_,dst_offset,pDVar1 + instr.field_2.imm_u32x2.snd,(ulong)uVar3,
                       (ulong)uVar2);
  RVar5 = Ok;
  if (RVar4.enum_ == Error) {
    store = this->store_;
    std::__cxx11::string::string
              ((string *)&local_50,"out of bounds memory access: memory.init out of bounds",
               &local_81);
    Trap::New(&local_68,store,&local_50,&this->frames_);
    out_trap->obj_ = local_68.obj_;
    out_trap->store_ = local_68.store_;
    out_trap->root_index_ = local_68.root_index_;
    local_68.obj_ = (Trap *)0x0;
    local_68.store_ = (Store *)0x0;
    local_68.root_index_ = 0;
    RefPtr<wabt::interp::Trap>::reset(&local_68);
    std::__cxx11::string::_M_dispose();
    RVar5 = Trap;
  }
  RefPtr<wabt::interp::Memory>::reset(&memory);
  return RVar5;
}

Assistant:

RunResult Thread::DoMemoryInit(Instr instr, Trap::Ptr* out_trap) {
  Memory::Ptr memory{store_, inst_->memories()[instr.imm_u32x2.fst]};
  auto&& data = inst_->datas()[instr.imm_u32x2.snd];
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  auto dst = PopPtr(memory);
  TRAP_IF(Failed(memory->Init(dst, data, src, size)),
          "out of bounds memory access: memory.init out of bounds");
  return RunResult::Ok;
}